

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

treeNode * printStmt(void)

{
  treeNode *this;
  treeNode *extraout_RAX;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  string local_58;
  string local_38;
  
  this = (treeNode *)operator_new(0x58);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  treeNode::treeNode(this,printStmt,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"print","");
  match(&local_38,Empty);
  __x = extraout_XMM0_Qa;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
    __x = extraout_XMM0_Qa_00;
  }
  exp(__x);
  this->child[0] = extraout_RAX;
  return this;
}

Assistant:

treeNode* printStmt()
{
    auto ret = new treeNode(StmtKind::printStmt,"");
    match("print");
    ret->child[0]=exp();
    return ret;
}